

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                    (EpsCopyOutputStream *stream,int32_t value,uint8_t *target)

{
  uint8_t *puVar1;
  uint8_t *target_local;
  int32_t value_local;
  EpsCopyOutputStream *stream_local;
  
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar1 = WriteInt32ToArray(1,value,puVar1);
  return puVar1;
}

Assistant:

PROTOBUF_NOINLINE static uint8_t* WriteInt32ToArrayWithField(
      ::google::protobuf::io::EpsCopyOutputStream* stream, int32_t value,
      uint8_t* target) {
    target = stream->EnsureSpace(target);
    return WriteInt32ToArray(field_number, value, target);
  }